

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnSurfaceProjection.h
# Opt level: O3

ParameterPoint * __thiscall
anurbs::PointOnSurfaceProjection<3L>::triangle_projection
          (ParameterPoint *__return_storage_ptr__,PointOnSurfaceProjection<3L> *this,Vector *point,
          size_t *index_a,size_t *index_b,size_t *index_c)

{
  size_t sVar1;
  pointer pPVar2;
  size_t sVar3;
  size_t sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  sVar1 = *index_a;
  pPVar2 = (this->m_tessellation).
           super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar5 = *(double *)
           &pPVar2[sVar1].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
            m_storage;
  dVar6 = pPVar2[sVar1].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
          .m_data.array[1];
  dVar15 = pPVar2[sVar1].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[2];
  sVar3 = *index_b;
  sVar4 = *index_c;
  dVar7 = *(double *)
           &pPVar2[sVar3].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
            m_storage - dVar5;
  dVar8 = pPVar2[sVar3].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
          .m_data.array[1] - dVar6;
  dVar11 = pPVar2[sVar3].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[2] - dVar15;
  dVar12 = *(double *)
            &pPVar2[sVar4].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage - dVar5;
  dVar13 = pPVar2[sVar4].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[1] - dVar6;
  dVar5 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0] - dVar5;
  dVar6 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1] - dVar6;
  dVar14 = pPVar2[sVar4].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[2] - dVar15;
  dVar15 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[2] - dVar15;
  dVar17 = dVar14 * dVar8 - dVar13 * dVar11;
  dVar18 = dVar12 * dVar11 - dVar14 * dVar7;
  dVar16 = dVar13 * dVar7 - dVar8 * dVar12;
  dVar19 = dVar18 * dVar18 + dVar17 * dVar17 + dVar16 * dVar16;
  auVar9._8_8_ = (dVar5 * dVar13 - dVar6 * dVar12) * dVar16 +
                 (dVar12 * dVar15 - dVar5 * dVar14) * dVar18 +
                 (dVar6 * dVar14 - dVar15 * dVar13) * dVar17;
  auVar9._0_8_ = (dVar11 * dVar5 - dVar15 * dVar7) * dVar18 +
                 (dVar8 * dVar15 - dVar6 * dVar11) * dVar17 +
                 (dVar6 * dVar7 - dVar8 * dVar5) * dVar16;
  auVar10._8_8_ = dVar19;
  auVar10._0_8_ = dVar19;
  auVar10 = divpd(auVar9,auVar10);
  dVar5 = auVar10._0_8_;
  dVar7 = auVar10._8_8_;
  dVar15 = (1.0 - dVar5) - dVar7;
  dVar6 = dVar5 * pPVar2[sVar4].parameter_u +
          dVar15 * pPVar2[sVar1].parameter_u + dVar7 * pPVar2[sVar3].parameter_u;
  dVar15 = dVar5 * pPVar2[sVar4].parameter_v +
           dVar15 * pPVar2[sVar1].parameter_v + dVar7 * pPVar2[sVar3].parameter_v;
  (*((this->m_surface).super___shared_ptr<anurbs::SurfaceBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_SurfaceBase[6])(SUB84(dVar6,0),dVar15,&__return_storage_ptr__->point);
  __return_storage_ptr__->parameter_u = dVar6;
  __return_storage_ptr__->parameter_v = dVar15;
  return __return_storage_ptr__;
}

Assistant:

ParameterPoint triangle_projection(const Vector point,
        const size_t& index_a, const size_t& index_b, const size_t& index_c)
    {
        const auto a = m_tessellation[index_a];
        const auto b = m_tessellation[index_b];
        const auto c = m_tessellation[index_c];

        const Vector u = b.point - a.point;
        const Vector v = c.point - a.point;
        const Vector n = cross(u, v);
        const Vector w = point - a.point;

        const double gam = dot(cross(u, w), n) / squared_norm(n);
        const double bet = dot(cross(w, v), n) / squared_norm(n);
        const double alp = 1.0 - gam - bet;

        const double parameter_u = alp * a.parameter_u + bet * b.parameter_u +
            gam * c.parameter_u;
        const double parameter_v = alp * a.parameter_v + bet * b.parameter_v +
            gam * c.parameter_v;

        const Vector closest_point =
            m_surface->point_at(parameter_u, parameter_v);

        return {parameter_u, parameter_v, closest_point};
    }